

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall gl4cts::ShaderSubroutine::FunctionalTest18_19::initTest(FunctionalTest18_19 *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  GLenum GVar5;
  GLint GVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  TestError *pTVar8;
  allocator<char> local_f1;
  uint bo_size;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  uint local_44;
  undefined1 local_40 [4];
  uint n_varyings;
  string vs_body;
  char *varyings [1];
  Functions *gl;
  FunctionalTest18_19 *this_local;
  Functions *gl_00;
  
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar7->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar3);
  vs_body.field_2._8_8_ = (long)" expected: result" + 0xb;
  getVertexShaderBody_abi_cxx11_((string *)local_40,this);
  local_44 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&bo_size,"",&local_f1);
  bVar2 = Utils::buildProgram(gl_00,(string *)local_40,&local_68,&local_a0,&local_c8,
                              (string *)&bo_size,(GLchar **)((long)&vs_body.field_2 + 8),&local_44,
                              &this->m_vs_id,(GLuint *)0x0,(GLuint *)0x0,(GLuint *)0x0,(GLuint *)0x0
                              ,&this->m_po_id);
  std::__cxx11::string::~string((string *)&bo_size);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Failed to build test program object",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x2577);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  GVar4 = (*gl_00->getSubroutineIndex)(this->m_po_id,0x8b31,"divideByTwo");
  this->m_po_subroutine_divide_by_two_location = GVar4;
  GVar4 = (*gl_00->getSubroutineIndex)(this->m_po_id,0x8b31,"multiplyByFour");
  this->m_po_subroutine_multiply_by_four_location = GVar4;
  GVar4 = (*gl_00->getSubroutineIndex)(this->m_po_id,0x8b31,"returnsFalse");
  this->m_po_subroutine_returns_false_location = GVar4;
  GVar4 = (*gl_00->getSubroutineIndex)(this->m_po_id,0x8b31,"returnsTrue");
  this->m_po_subroutine_returns_true_location = GVar4;
  GVar5 = (*gl_00->getError)();
  glu::checkError(GVar5,"glGetSubroutineIndex() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x257f);
  if ((((this->m_po_subroutine_divide_by_two_location != 0xffffffff) &&
       (this->m_po_subroutine_multiply_by_four_location != 0xffffffff)) &&
      (this->m_po_subroutine_returns_false_location != 0xffffffff)) &&
     (this->m_po_subroutine_returns_true_location != 0xffffffff)) {
    GVar6 = (*gl_00->getSubroutineUniformLocation)(this->m_po_id,0x8b31,"bool_operator1");
    this->m_po_subroutine_uniform_bool_operator1 = GVar6;
    GVar6 = (*gl_00->getSubroutineUniformLocation)(this->m_po_id,0x8b31,"bool_operator2");
    this->m_po_subroutine_uniform_bool_operator2 = GVar6;
    GVar6 = (*gl_00->getSubroutineUniformLocation)(this->m_po_id,0x8b31,"vec4_operator1");
    this->m_po_subroutine_uniform_vec4_processor1 = GVar6;
    GVar6 = (*gl_00->getSubroutineUniformLocation)(this->m_po_id,0x8b31,"vec4_operator2");
    this->m_po_subroutine_uniform_vec4_processor2 = GVar6;
    GVar5 = (*gl_00->getError)();
    glu::checkError(GVar5,"glGetSubroutineUniformLocation() call(s) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x2591);
    if (((this->m_po_subroutine_uniform_bool_operator1 != -1) &&
        (this->m_po_subroutine_uniform_bool_operator2 != -1)) &&
       ((this->m_po_subroutine_uniform_vec4_processor1 != -1 &&
        (this->m_po_subroutine_uniform_vec4_processor2 != -1)))) {
      uVar1 = this->m_n_points_to_draw;
      (*gl_00->genBuffers)(1,&this->m_xfb_bo_id);
      GVar5 = (*gl_00->getError)();
      glu::checkError(GVar5,"glGenBuffers() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x259d);
      (*gl_00->bindBuffer)(0x8c8e,this->m_xfb_bo_id);
      GVar5 = (*gl_00->getError)();
      glu::checkError(GVar5,"glBindBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x25a0);
      (*gl_00->bindBufferBase)(0x8c8e,0,this->m_xfb_bo_id);
      GVar5 = (*gl_00->getError)();
      glu::checkError(GVar5,"glBindBufferBase() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x25a3);
      (*gl_00->bufferData)(0x8c8e,(ulong)(uVar1 << 2),(void *)0x0,0x88e6);
      GVar5 = (*gl_00->getError)();
      glu::checkError(GVar5,"glBufferData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x25a6);
      (*gl_00->genVertexArrays)(1,&this->m_vao_id);
      GVar5 = (*gl_00->getError)();
      glu::checkError(GVar5,"glGenVertexArrays() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x25aa);
      (*gl_00->bindVertexArray)(this->m_vao_id);
      GVar5 = (*gl_00->getError)();
      glu::checkError(GVar5,"glBindVertexArray() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x25ad);
      std::__cxx11::string::~string((string *)local_40);
      return;
    }
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,
               "glGetSubroutineUniformLocation() returned -1 for an active subroutine uniform",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x2596);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,"glGetSubroutineIndex() returned GL_INVALID_INDEX for a valid subroutine",
             (char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
             ,0x2586);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void FunctionalTest18_19::initTest()
{
	const glw::Functions& gl		  = m_context.getRenderContext().getFunctions();
	const char*			  varyings[1] = { "result" };
	std::string			  vs_body	 = getVertexShaderBody();
	const unsigned int	n_varyings  = sizeof(varyings) / sizeof(varyings[0]);

	if (!Utils::buildProgram(gl, vs_body, "",						  /* tc_body */
							 "",									  /* te_body */
							 "",									  /* gs_body */
							 "",									  /* fs_body */
							 varyings, n_varyings, &m_vs_id, DE_NULL, /* out_tc_id */
							 DE_NULL,								  /* out_te_id */
							 DE_NULL,								  /* out_gs_id */
							 DE_NULL,								  /* out_fs_id */
							 &m_po_id))
	{
		TCU_FAIL("Failed to build test program object");
	}

	/* Retrieve subroutine & subroutine uniform locations */
	m_po_subroutine_divide_by_two_location	= gl.getSubroutineIndex(m_po_id, GL_VERTEX_SHADER, "divideByTwo");
	m_po_subroutine_multiply_by_four_location = gl.getSubroutineIndex(m_po_id, GL_VERTEX_SHADER, "multiplyByFour");
	m_po_subroutine_returns_false_location	= gl.getSubroutineIndex(m_po_id, GL_VERTEX_SHADER, "returnsFalse");
	m_po_subroutine_returns_true_location	 = gl.getSubroutineIndex(m_po_id, GL_VERTEX_SHADER, "returnsTrue");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineIndex() call(s) failed");

	if (m_po_subroutine_divide_by_two_location == GL_INVALID_INDEX ||
		m_po_subroutine_multiply_by_four_location == GL_INVALID_INDEX ||
		m_po_subroutine_returns_false_location == GL_INVALID_INDEX ||
		m_po_subroutine_returns_true_location == GL_INVALID_INDEX)
	{
		TCU_FAIL("glGetSubroutineIndex() returned GL_INVALID_INDEX for a valid subroutine");
	}

	m_po_subroutine_uniform_bool_operator1 =
		gl.getSubroutineUniformLocation(m_po_id, GL_VERTEX_SHADER, "bool_operator1");
	m_po_subroutine_uniform_bool_operator2 =
		gl.getSubroutineUniformLocation(m_po_id, GL_VERTEX_SHADER, "bool_operator2");
	m_po_subroutine_uniform_vec4_processor1 =
		gl.getSubroutineUniformLocation(m_po_id, GL_VERTEX_SHADER, "vec4_operator1");
	m_po_subroutine_uniform_vec4_processor2 =
		gl.getSubroutineUniformLocation(m_po_id, GL_VERTEX_SHADER, "vec4_operator2");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineUniformLocation() call(s) failed");

	if (m_po_subroutine_uniform_bool_operator1 == -1 || m_po_subroutine_uniform_bool_operator2 == -1 ||
		m_po_subroutine_uniform_vec4_processor1 == -1 || m_po_subroutine_uniform_vec4_processor2 == -1)
	{
		TCU_FAIL("glGetSubroutineUniformLocation() returned -1 for an active subroutine uniform");
	}

	/* Set up XFB BO */
	const unsigned int bo_size = static_cast<unsigned int>(sizeof(float) * m_n_points_to_draw);

	gl.genBuffers(1, &m_xfb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_xfb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_xfb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed.");

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, bo_size, DE_NULL /* data */, GL_STATIC_COPY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	/* Set up a VAO */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");
}